

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_extract_aux(REF_NODE ref_node,REF_INT *ldim,REF_DBL **aux)

{
  REF_DBL *pRVar1;
  int local_30;
  int local_2c;
  REF_INT node;
  REF_INT iaux;
  REF_DBL **aux_local;
  REF_INT *ldim_local;
  REF_NODE ref_node_local;
  
  *ldim = ref_node->naux;
  if (*ldim * ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa97,
           "ref_node_extract_aux","malloc *aux of REF_DBL negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    pRVar1 = (REF_DBL *)malloc((long)(*ldim * ref_node->max) << 3);
    *aux = pRVar1;
    if (*aux == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xa97,
             "ref_node_extract_aux","malloc *aux of REF_DBL NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (local_30 = 0; local_30 < ref_node->max; local_30 = local_30 + 1) {
        if (((-1 < local_30) && (local_30 < ref_node->max)) && (-1 < ref_node->global[local_30])) {
          for (local_2c = 0; local_2c < ref_node->naux; local_2c = local_2c + 1) {
            (*aux)[local_2c + *ldim * local_30] =
                 ref_node->aux[local_2c + ref_node->naux * local_30];
          }
        }
      }
      ref_node_local._4_4_ = 0;
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_extract_aux(REF_NODE ref_node, REF_INT *ldim,
                                        REF_DBL **aux) {
  REF_INT iaux, node;
  (*ldim) = ref_node_naux(ref_node);
  ref_malloc(*aux, (*ldim) * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    for (iaux = 0; iaux < ref_node_naux(ref_node); iaux++) {
      (*aux)[iaux + (*ldim) * node] = ref_node_aux(ref_node, iaux, node);
    }
  }
  return REF_SUCCESS;
}